

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Session::useConfigData(Session *this,ConfigData *configData)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  InWhatOrder IVar1;
  YesOrNo YVar2;
  When WVar3;
  uint uVar4;
  int iVar5;
  Verbosity VVar6;
  What WVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 uVar19;
  int iVar20;
  
  bVar8 = configData->listTests;
  bVar9 = configData->listTags;
  bVar10 = configData->listReporters;
  bVar11 = configData->listTestNamesOnly;
  bVar12 = configData->showSuccessfulTests;
  bVar13 = configData->shouldDebugBreak;
  bVar14 = configData->noThrow;
  bVar15 = configData->showHelp;
  bVar16 = configData->showInvisibles;
  bVar17 = configData->filenamesAsTags;
  bVar18 = configData->libIdentify;
  uVar19 = configData->field_0xb;
  iVar20 = configData->abortAfter;
  uVar4 = configData->rngSeed;
  iVar5 = configData->benchmarkResolutionMultiple;
  VVar6 = configData->verbosity;
  WVar7 = configData->warnings;
  IVar1 = configData->runOrder;
  YVar2 = configData->useColour;
  WVar3 = configData->waitForKeypress;
  (this->m_configData).showDurations = configData->showDurations;
  (this->m_configData).runOrder = IVar1;
  (this->m_configData).useColour = YVar2;
  (this->m_configData).waitForKeypress = WVar3;
  (this->m_configData).rngSeed = uVar4;
  (this->m_configData).benchmarkResolutionMultiple = iVar5;
  (this->m_configData).verbosity = VVar6;
  (this->m_configData).warnings = WVar7;
  (this->m_configData).listTests = bVar8;
  (this->m_configData).listTags = bVar9;
  (this->m_configData).listReporters = bVar10;
  (this->m_configData).listTestNamesOnly = bVar11;
  (this->m_configData).showSuccessfulTests = bVar12;
  (this->m_configData).shouldDebugBreak = bVar13;
  (this->m_configData).noThrow = bVar14;
  (this->m_configData).showHelp = bVar15;
  (this->m_configData).showInvisibles = bVar16;
  (this->m_configData).filenamesAsTags = bVar17;
  (this->m_configData).libIdentify = bVar18;
  (this->m_configData).field_0xb = uVar19;
  (this->m_configData).abortAfter = iVar20;
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).outputFilename);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).name);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).processName);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).reporterName);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->m_configData).testsOrTags,&configData->testsOrTags);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->m_configData).sectionsToRun,&configData->sectionsToRun);
  this_00 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void Session::useConfigData( ConfigData const& configData ) {
        m_configData = configData;
        m_config.reset();
    }